

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateFunctionCallByName
          (ExpressionContext *ctx,SynBase *source,InplaceStr name,ArrayView<ArgumentData> arguments,
          bool allowFailure,bool allowInternal,bool allowFastLookup)

{
  Allocator *pAVar1;
  FunctionData *pFVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  uint uVar6;
  int iVar7;
  ScopeData *pSVar8;
  IdentifierLookupResult *pIVar9;
  ExprBase *pEVar10;
  SynBase *pSVar11;
  size_t sVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeBase *pTVar13;
  _func_int **pp_Var14;
  TypeError *pTVar15;
  ulong uVar16;
  char *str;
  Node *pNVar17;
  ArgumentData *pAVar18;
  uint uVar19;
  char *dst;
  char *pcVar20;
  long lVar21;
  ArrayView<ArgumentData> arguments_02;
  ArrayView<ArgumentData> arguments_03;
  ArrayView<FunctionValue> functions_00;
  FunctionLookupChain function;
  SmallArray<FunctionValue,_32U> functions;
  uint uStack_3ec;
  undefined4 uStack_3dc;
  uint uStack_3cc;
  undefined4 uStack_3ac;
  FunctionLookupChain local_3a8;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  FunctionLookupChain local_360;
  undefined1 local_348 [784];
  Allocator *local_38;
  undefined4 extraout_var_01;
  
  pcVar20 = name.end;
  str = name.begin;
  pAVar18 = arguments.data;
  uVar19 = arguments.count;
  auVar3 = arguments._0_12_;
  if (allowFastLookup) {
    for (pSVar8 = ctx->scope; pSVar8 != (ScopeData *)0x0; pSVar8 = pSVar8->scope) {
      pTVar13 = pSVar8->ownerType;
      if (pTVar13 != (TypeBase *)0x0) {
        uVar6 = NULLC::StringHashContinue(pTVar13->nameHash,"::");
        uVar6 = NULLC::StringHashContinue(uVar6,str,pcVar20);
        pIVar9 = anon_unknown.dwarf_9c70f::LookupObjectByName(ctx,uVar6);
        if ((((pIVar9 != (IdentifierLookupResult *)0x0) && (pIVar9->function != (FunctionData *)0x0)
             ) && (auVar5._8_8_ = 0, auVar5._0_8_ = pTVar13,
                  pEVar10 = CreateVariableAccess
                                      (ctx,source,(IntrusiveList<SynIdentifier>)(auVar5 << 0x40),
                                       name,allowInternal), pEVar10 != (ExprBase *)0x0)) &&
           (arguments_03._12_4_ = 0, arguments_03.data = (ArgumentData *)auVar3._0_8_,
           arguments_03.count = auVar3._8_4_,
           pEVar10 = CreateFunctionCall(ctx,source,pEVar10,arguments_03,allowFailure),
           pEVar10 != (ExprBase *)0x0)) {
          return pEVar10;
        }
        break;
      }
    }
    pSVar8 = (ScopeData *)&ctx->scope;
    uVar6 = NULLC::GetStringHash(str,pcVar20);
    do {
      pSVar8 = pSVar8->scope;
      if (pSVar8 == (ScopeData *)0x0) goto joined_r0x0015ba4d;
      local_3a8.node = DirectChainedMap<IdentifierLookupResult>::first(&pSVar8->idLookupMap,uVar6);
      pNVar17 = local_3a8.node.node;
    } while (pNVar17 == (Node *)0x0);
    if (*(long *)(pNVar17 + 0x10) == 0) {
joined_r0x0015ba4d:
      if (allowFailure) {
        return (ExprBase *)0x0;
      }
      goto LAB_0015bcdc;
    }
    pAVar1 = ctx->allocator;
    local_3a8.scope = pSVar8;
    memset((ExprBase *)(local_348 + 0x10),0,0x300);
    local_348._8_4_ = 0;
    local_348._12_4_ = 0x20;
    local_348._0_8_ = (ExprBase *)(local_348 + 0x10);
    local_38 = pAVar1;
    do {
      pFVar2 = *(FunctionData **)(pNVar17 + 0x10);
      pSVar11 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      pSVar11 = (SynBase *)
                CreateFunctionContextAccess(ctx,pSVar11,*(FunctionData **)(pNVar17 + 0x10));
      if (pSVar11 == (SynBase *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                      ,0x289,"FunctionValue::FunctionValue(SynBase *, FunctionData *, ExprBase *)");
      }
      if (local_348._8_4_ == local_348._12_4_) {
        SmallArray<FunctionValue,_32U>::grow
                  ((SmallArray<FunctionValue,_32U> *)local_348,local_348._8_4_);
      }
      if ((ExprBase *)local_348._0_8_ == (ExprBase *)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<FunctionValue, 32>::push_back(const T &) [T = FunctionValue, N = 32]"
                     );
      }
      uVar16 = (ulong)(uint)local_348._8_4_;
      local_348._8_4_ = local_348._8_4_ + 1;
      ((SynBase **)local_348._0_8_)[uVar16 * 3] = source;
      ((FunctionData **)(local_348._0_8_ + 8))[uVar16 * 3] = pFVar2;
      ((SynBase **)(local_348._0_8_ + 0x10))[uVar16 * 3] = pSVar11;
      anon_unknown.dwarf_9c70f::FunctionLookupChain::next(&local_360,&local_3a8);
      local_3a8.scope = local_360.scope;
      local_3a8.node.node = local_360.node.node;
      local_3a8.node.start = local_360.node.start;
      pNVar17 = local_360.node.node;
    } while (local_360.node.node != (Node *)0x0);
    functions_00.count = local_348._8_4_;
    functions_00.data = (FunctionValue *)local_348._0_8_;
    local_378 = 0;
    uStack_370 = 0;
    arguments_00._12_4_ = uStack_3ac;
    arguments_00.count = uVar19;
    arguments_00.data = pAVar18;
    functions_00._12_4_ = 0;
    pEVar10 = CreateFunctionCallFinal
                        (ctx,source,(ExprBase *)0x0,functions_00,
                         (IntrusiveList<TypeHandle>)ZEXT816(0),arguments_00,true);
    SmallArray<FunctionValue,_32U>::~SmallArray((SmallArray<FunctionValue,_32U> *)local_348);
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = pcVar20;
    pEVar10 = CreateVariableAccess
                        (ctx,source,(IntrusiveList<SynIdentifier>)(auVar4 << 0x40),name,
                         allowInternal);
    if (pEVar10 == (ExprBase *)0x0) goto joined_r0x0015ba4d;
    arguments_02._12_4_ = 0;
    arguments_02.data = (ArgumentData *)auVar3._0_8_;
    arguments_02.count = auVar3._8_4_;
    pEVar10 = CreateFunctionCall(ctx,source,pEVar10,arguments_02,allowFailure);
  }
  if (pEVar10 != (ExprBase *)0x0 || allowFailure) {
    return pEVar10;
  }
LAB_0015bcdc:
  pcVar20 = ctx->errorBuf;
  if ((pcVar20 != (char *)0x0) && (ctx->errorBufSize != 0)) {
    if (ctx->errorCount == 0) {
      ctx->errorPos = (source->pos).begin;
      ctx->errorBufLocation = pcVar20;
      dst = pcVar20;
    }
    else {
      dst = ctx->errorBufLocation;
    }
    NULLC::SafeSprintf(dst,(ulong)(ctx->errorBufSize + ((int)pcVar20 - (int)dst)),
                       "ERROR: can\'t find function \'%.*s\' with following arguments:\n",
                       (ulong)(uint)((int)name.end - (int)name.begin),str);
    pcVar20 = ctx->errorBufLocation;
    sVar12 = strlen(pcVar20);
    pcVar20 = pcVar20 + sVar12;
    ctx->errorBufLocation = pcVar20;
    local_388 = 0;
    uStack_380 = 0;
    arguments_01._12_4_ = uStack_3dc;
    arguments_01.count = uVar19;
    arguments_01.data = pAVar18;
    ReportOnFunctionSelectError
              (ctx,source,pcVar20,(*(int *)&ctx->errorBuf - (int)pcVar20) + ctx->errorBufSize,dst,
               name,(ArrayView<FunctionValue>)(ZEXT416(uStack_3cc) << 0x60),
               (IntrusiveList<TypeHandle>)ZEXT816(0),arguments_01,
               (ArrayView<unsigned_int>)(ZEXT416(uStack_3ec) << 0x60),0xffffffff,true);
    pcVar20 = ctx->errorBufLocation;
    sVar12 = strlen(pcVar20);
    ctx->errorBufLocation = pcVar20 + sVar12;
  }
  if (ctx->errorHandlerNested != true) {
    ctx->errorCount = ctx->errorCount + 1;
    local_348._0_8_ = (ExprBase *)0x0;
    local_348._8_4_ = 0;
    local_348._12_4_ = 0;
    if (uVar19 != 0) {
      lVar21 = 0;
      do {
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar10 = *(ExprBase **)((long)&pAVar18->value + lVar21);
        ExprPassthrough::ExprPassthrough
                  ((ExprPassthrough *)CONCAT44(extraout_var,iVar7),pEVar10->source,pEVar10->type,
                   pEVar10);
        IntrusiveList<ExprBase>::push_back
                  ((IntrusiveList<ExprBase> *)local_348,(ExprBase *)CONCAT44(extraout_var,iVar7));
        lVar21 = lVar21 + 0x30;
      } while ((ulong)uVar19 * 0x30 != lVar21);
    }
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_00,iVar7);
    pTVar13 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pp_Var14 = (_func_int **)CONCAT44(extraout_var_01,iVar7);
    pTVar15 = ExpressionContext::GetErrorType(ctx);
    *(undefined4 *)(pp_Var14 + 1) = 0;
    pp_Var14[2] = (_func_int *)source;
    pp_Var14[3] = (_func_int *)pTVar15;
    pp_Var14[4] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var14 + 5) = 0;
    *pp_Var14 = (_func_int *)&PTR__ExprError_00223b38;
    pp_Var14[0xc] = (_func_int *)0x0;
    pp_Var14[6] = (_func_int *)(pp_Var14 + 8);
    pp_Var14[7] = (_func_int *)0x400000000;
    pEVar10->typeID = 0x29;
    pEVar10->source = source;
    pEVar10->type = pTVar13;
    pEVar10->next = (ExprBase *)0x0;
    pEVar10->listed = false;
    pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223f28;
    pEVar10[1]._vptr_ExprBase = pp_Var14;
    *(undefined8 *)&pEVar10[1].typeID = local_348._0_8_;
    pEVar10[1].source = (SynBase *)CONCAT44(local_348._12_4_,local_348._8_4_);
    return pEVar10;
  }
  if (ctx->errorHandlerActive != false) {
    longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
  }
  __assert_fail("ctx.errorHandlerActive",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x1c38,
                "ExprBase *CreateFunctionCallByName(ExpressionContext &, SynBase *, InplaceStr, ArrayView<ArgumentData>, bool, bool, bool)"
               );
}

Assistant:

ExprBase* CreateFunctionCallByName(ExpressionContext &ctx, SynBase *source, InplaceStr name, ArrayView<ArgumentData> arguments, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	if(allowFastLookup)
	{
		if(TypeBase *nextType = FindNextTypeFromScope(ctx.scope))
		{
			unsigned hash = nextType->nameHash;

			hash = NULLC::StringHashContinue(hash, "::");
			hash = NULLC::StringHashContinue(hash, name.begin, name.end);

			if(LookupFunctionByName(ctx, hash))
			{
				if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), name, allowInternal))
				{
					if(ExprBase *result = CreateFunctionCall(ctx, source, overloads, arguments, allowFailure))
						return result;
				}
			}
		}

		if(FunctionLookupChain function = LookupFunctionChainByName(ctx, name.hash()))
		{
			// Collect a set of available functions
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			while(function)
			{
				functions.push_back(FunctionValue(source, *function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), *function)));

				function = function.next();
			}

			if(ExprBase *result = CreateFunctionCallFinal(ctx, source, NULL, functions, IntrusiveList<TypeHandle>(), arguments, true))
				return result;
		}
	}
	else
	{
		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), name, allowInternal))
		{
			if(ExprBase *result = CreateFunctionCall(ctx, source, overloads, arguments, allowFailure))
				return result;
		}
	}

	if(!allowFailure)
	{
		IntrusiveList<TypeHandle> generics;
		ArrayView<FunctionValue> functions;
		ArrayView<unsigned> ratings;

		if(ctx.errorBuf && ctx.errorBufSize)
		{
			if(ctx.errorCount == 0)
			{
				ctx.errorPos = source->pos.begin;
				ctx.errorBufLocation = ctx.errorBuf;
			}

			const char *messageStart = ctx.errorBufLocation;

			NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: can't find function '%.*s' with following arguments:\n", FMT_ISTR(name));

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, name, functions, generics, arguments, ratings, ~0u, true);

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);
		}

		if(ctx.errorHandlerNested)
		{
			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}

		ctx.errorCount++;

		IntrusiveList<ExprBase> errorArguments;

		for(unsigned i = 0; i < arguments.size(); i++)
			errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

		return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType()), errorArguments);
	}

	return NULL;
}